

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineArguments_lotsOfGroupsAndTests_Test::
TEST_CommandLineArguments_lotsOfGroupsAndTests_Test
          (TEST_CommandLineArguments_lotsOfGroupsAndTests_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args = (CommandLineArguments *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).plugin = (OptionsPlugin *)0x0;
  TEST_GROUP_CppUTestGroupCommandLineArguments::TEST_GROUP_CppUTestGroupCommandLineArguments
            (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments);
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_00344578;
  return;
}

Assistant:

TEST(CommandLineArguments, lotsOfGroupsAndTests)
{
    int argc = 10;
    const char* argv[] = { "tests.exe", "-sggroup1", "-xntest1", "-sggroup2", "-sntest2", "-sntest3", "-sggroup3", "-sntest4", "-sggroup4", "-sntest5" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("test1");
    nameFilter.invertMatching();
    TestFilter groupFilter("group1");
    groupFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters()->getNext()->getNext()->getNext()->getNext());
    CHECK_EQUAL(groupFilter, *args->getGroupFilters()->getNext()->getNext()->getNext());
}